

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O3

size_t __thiscall
CVmObjClass::list_class_props
          (CVmObjClass *this,vm_obj_id_t self,vm_meta_entry_t *entry,CVmObjList *lst,
          size_t starting_idx,int static_only)

{
  ushort uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  ushort uVar5;
  size_t sVar6;
  vm_obj_id_t source_obj;
  vm_val_t val;
  vm_obj_id_t local_54;
  size_t local_50;
  CVmObjList *local_48;
  vm_val_t local_40;
  
  if (entry->func_xlat_cnt_ == 0) {
    sVar6 = 0;
  }
  else {
    uVar4 = 1;
    uVar5 = 2;
    sVar6 = 0;
    local_50 = starting_idx;
    local_48 = lst;
    do {
      if (((uVar5 != 1) && (uVar1 = entry->func_xlat_[(int)uVar4 - 1], uVar1 != 0)) &&
         ((static_only == 0 ||
          ((iVar3 = (*(this->super_CVmObject)._vptr_CVmObject[0xd])
                              (this,(ulong)uVar1,&local_40,(ulong)self,&local_54,0), iVar3 != 0 &&
           (local_54 == self)))))) {
        sVar2 = local_50;
        if (local_48 != (CVmObjList *)0x0) {
          local_40.typ = VM_PROP;
          local_40.val.prop = uVar1;
          CVmObjList::cons_set_element(local_48,local_50,&local_40);
          local_50 = sVar2 + 1;
        }
        sVar6 = sVar6 + 1;
      }
      uVar4 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar4 <= entry->func_xlat_cnt_);
  }
  return sVar6;
}

Assistant:

size_t CVmObjClass::list_class_props(VMG_ vm_obj_id_t self,
                                      vm_meta_entry_t *entry,
                                      CVmObjList *lst, size_t starting_idx,
                                      int static_only)
{
    ushort i;
    size_t cnt;
    size_t idx;
    
    /* count the valid entries */
    for (i = 1, idx = starting_idx, cnt = 0 ;
         i <= entry->func_xlat_cnt_ ; ++i)
    {
        vm_prop_id_t prop;
        vm_val_t val;
        vm_obj_id_t source_obj;

        /* get this property */
        prop = entry->xlat_func(i);
        
        /* 
         *   If this one's valid, check to see if it's we're interested in
         *   it.  If we want only statics, include it only if it's
         *   implemented as a static method on this intrinsic class object;
         *   otherwise, include it unconditionally.
         *   
         *   To determine if the property is implemented as a static, call
         *   the property on self without an argc pointer - this is the
         *   special form of the call which merely retrieves the value of the
         *   property without evaluating it.  If the property is defined on
         *   the object, and the source of the definition is self, include
         *   this one in the list of directly-defined properties.  
         */
        if (prop != VM_INVALID_PROP
            && (!static_only
                || (get_prop(vmg_ prop, &val, self, &source_obj, 0)
                    && source_obj == self)))
        {
            /* we're interested - add it to the list if we have one */
            if (lst != 0)
            {
                /* set up a value containing the property pointer */
                val.set_propid(prop);

                /* add it to the list at the next free slot */
                lst->cons_set_element(idx, &val);

                /* advance to the next slot */
                ++idx;
            }

            /* count it */
            ++cnt;
        }
    }

    /* return the number of properties we found */
    return cnt;
}